

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O3

Token * __thiscall Token_stream::get(Token *__return_storage_ptr__,Token_stream *this)

{
  uint uVar1;
  pointer pcVar2;
  double dVar3;
  undefined7 uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  long *plVar8;
  undefined8 uVar9;
  char cVar10;
  int iVar11;
  char ch;
  string s;
  string local_78;
  double local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->full == true) {
    this->full = false;
    uVar4 = *(undefined7 *)&(this->buffer).field_0x1;
    dVar3 = (this->buffer).value;
    __return_storage_ptr__->kind = (this->buffer).kind;
    *(undefined7 *)&__return_storage_ptr__->field_0x1 = uVar4;
    __return_storage_ptr__->value = dVar3;
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    pcVar2 = (this->buffer).name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->name,pcVar2,
               pcVar2 + (this->buffer).name._M_string_length);
    return __return_storage_ptr__;
  }
  uVar5 = std::istream::get();
  cVar10 = (char)uVar5;
  iVar11 = (int)cVar10;
  uVar1 = iVar11 - 0x23;
  if (uVar1 < 0x36) {
    if ((0x50017e5UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((0x28064300000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        std::istream::unget();
        get_numeral((Roman_int *)&local_78,(istream *)&std::cin);
        uVar6 = Roman_int::as_int((Roman_int *)&local_78);
        local_58 = (double)uVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        __return_storage_ptr__->kind = '8';
        __return_storage_ptr__->value = local_58;
        (__return_storage_ptr__->name)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->name).field_2;
        (__return_storage_ptr__->name)._M_string_length = 0;
        goto LAB_001044ed;
      }
      goto LAB_00104503;
    }
    __return_storage_ptr__->kind = cVar10;
  }
  else {
LAB_00104503:
    iVar7 = isalpha(iVar11);
    if (iVar7 != 0) {
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::push_back((char)&local_78);
      while (plVar8 = (long *)std::istream::get((char *)this->is),
            (*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
        iVar11 = isalpha((int)cVar10);
        if ((iVar11 == 0) && (cVar10 != '_' && 9 < (int)cVar10 - 0x30U)) break;
        std::__cxx11::string::push_back((char)&local_78);
      }
      std::istream::unget();
      iVar11 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar11 == 0) {
        __return_storage_ptr__->kind = 'Q';
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar11 == 0) {
          __return_storage_ptr__->kind = 'R';
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar11 == 0) {
            __return_storage_ptr__->kind = 'P';
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar11 == 0) {
              __return_storage_ptr__->kind = 'C';
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)&local_78);
              if (iVar11 == 0) {
                __return_storage_ptr__->kind = 'H';
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)&local_78);
                if (iVar11 == 0) {
                  __return_storage_ptr__->kind = 'N';
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)&local_78);
                  if (iVar11 == 0) {
                    __return_storage_ptr__->kind = 'F';
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)&local_78);
                    if (iVar11 != 0) {
                      local_50 = local_40;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_50,local_78._M_dataplus._M_p,
                                 local_78._M_dataplus._M_p + local_78._M_string_length);
                      __return_storage_ptr__->kind = 'a';
                      __return_storage_ptr__->value = 0.0;
                      (__return_storage_ptr__->name)._M_dataplus._M_p =
                           (pointer)&(__return_storage_ptr__->name).field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&__return_storage_ptr__->name,local_50,
                                 (long)local_50 + local_48);
                      if (local_50 != local_40) {
                        operator_delete(local_50,local_40[0] + 1);
                      }
                      goto LAB_0010472e;
                    }
                    __return_storage_ptr__->kind = 'T';
                  }
                }
              }
            }
          }
        }
      }
      __return_storage_ptr__->value = 0.0;
      (__return_storage_ptr__->name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->name).field_2;
      (__return_storage_ptr__->name)._M_string_length = 0;
      (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
LAB_0010472e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
      return __return_storage_ptr__;
    }
    iVar11 = isspace(iVar11);
    if (iVar11 == 0) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Bad token","");
      error(&local_78);
      uVar9 = std::__cxx11::string::~string((string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50 != &local_78.field_2) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_78._M_dataplus._M_p != (pointer)(ulong)uVar5) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      _Unwind_Resume(uVar9);
    }
    if ((uVar5 & 0xff) != 10) {
      get(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->kind = ';';
  }
  __return_storage_ptr__->value = 0.0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
LAB_001044ed:
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Token Token_stream::get()
{
	if (full) { full = false; return buffer; }
	char ch;
	ch = is.get();
	switch (ch)
	{
	case '(':
	case ')':
	case '+':
	case '-':
	case '*':
	case '/':
	case '%':
	case ';':
	case ',':
	case '=':
	case '#':
		return Token(ch);
	case 'I':
	case 'V':
	case 'X':
	case 'L':
	case 'C':
	case 'D':
	case 'M':
	{
		cin.unget(); // put back character to read full double later
		double val = get_numeral(cin).as_int();
		return Token(number, val);
	}
	default:
		if (isalpha(ch))
		{
			string s;
			s += ch;
			while (is.get(ch) && (isalpha(ch) || isdigit(ch) || ch == '_'))
				s += ch;
			cin.unget();
			if (s == "exit")
				return Token(quit);
			if (s == "sqrt")
				return Token(square_root);
			if (s == "pow")
				return Token(power);
			if (s == "const")
				return Token(constant);
			if (s == "help")
				return Token(help);
			if (s == "ln")
				return Token(natural_log);
			if (s == "from")
				return Token(from);
			if (s == "to")
				return Token(to);
			return Token(name, s);
		}
		else if (isspace(ch))
		{
			if (ch == '\n')
				return Token(print);
			return get();
		}
		error("Bad token");
	}
}